

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_75e5::test_art_upper_bound(void **param_1)

{
  initializer_list<const_char_*> __l;
  initializer_list<unsigned_long> __l_00;
  undefined1 uVar1;
  size_type sVar2;
  art_iterator_t iterator_2;
  char *key_2;
  art_iterator_t iterator_1;
  char *key_1;
  size_t i_1;
  art_iterator_t iterator;
  char *key;
  size_t i;
  art_t art;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  undefined4 in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  art_t *in_stack_fffffffffffffc88;
  art_key_chunk_t *key_00;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  allocator_type *in_stack_fffffffffffffca8;
  size_type sVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffcb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  iterator ppcVar4;
  size_type in_stack_fffffffffffffcc0;
  undefined8 *local_2a0;
  size_type local_210;
  size_type local_170;
  undefined1 local_c9 [25];
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined1 *local_98;
  undefined8 local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  undefined1 local_59;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  char **local_30;
  undefined8 local_28;
  vector<const_char_*,_std::allocator<const_char_*>_> local_20;
  
  local_38 = "001005";
  local_48 = "000003";
  pcStack_40 = "000004";
  local_58 = "000001";
  pcStack_50 = "000002";
  local_30 = &local_58;
  local_28 = 5;
  ppcVar4 = (iterator)&local_59;
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x10529a);
  __l._M_len = in_stack_fffffffffffffcc0;
  __l._M_array = ppcVar4;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (in_stack_fffffffffffffcb0,__l,(allocator_type *)in_stack_fffffffffffffca8);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x1052cb);
  local_c9._17_8_ = 3;
  uStack_b0 = 4;
  local_c9._1_8_ = 1;
  local_c9._9_8_ = 2;
  local_a8 = 5;
  local_98 = local_c9 + 1;
  local_90 = 5;
  this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c9;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x105323);
  __l_00._M_len = in_stack_fffffffffffffcc0;
  __l_00._M_array = (iterator)ppcVar4;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this,__l_00,in_stack_fffffffffffffca8);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x105354);
  art_init_cleared((art_t *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  local_170 = 0;
  while( true ) {
    sVar3 = local_170;
    sVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_20);
    if (sVar2 <= sVar3) break;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_20,local_170);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_88,local_170);
    art_insert(in_stack_fffffffffffffc88,
               (art_key_chunk_t *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    assert_art_valid((art_t *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    local_170 = local_170 + 1;
  }
  art_upper_bound((art_t *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                  (art_key_chunk_t *)in_stack_fffffffffffffc88);
  local_210 = 2;
  do {
    _assert_true(CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                 (char *)in_stack_fffffffffffffc88,
                 (char *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 in_stack_fffffffffffffc7c);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_20,local_210);
    assert_key_eq((art_key_chunk_t *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                  (art_key_chunk_t *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_88,local_210);
    _assert_true(CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                 (char *)in_stack_fffffffffffffc88,
                 (char *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 in_stack_fffffffffffffc7c);
    local_210 = local_210 + 1;
    in_stack_fffffffffffffc97 = art_iterator_next((art_iterator_t *)0x105583);
  } while ((bool)in_stack_fffffffffffffc97);
  art_upper_bound((art_t *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                  (art_key_chunk_t *)in_stack_fffffffffffffc88);
  _assert_true(CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (char *)in_stack_fffffffffffffc88,
               (char *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc7c);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_20,4);
  assert_key_eq((art_key_chunk_t *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                (art_key_chunk_t *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  key_00 = (art_key_chunk_t *)*local_2a0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_88,4);
  _assert_true(CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),(char *)key_00,
               (char *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc7c);
  uVar1 = art_iterator_next((art_iterator_t *)0x105675);
  _assert_true(CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),(char *)key_00,
               (char *)CONCAT17(uVar1,in_stack_fffffffffffffc80),in_stack_fffffffffffffc7c);
  art_upper_bound((art_t *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),key_00);
  _assert_true(CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),(char *)key_00,
               (char *)CONCAT17(uVar1,in_stack_fffffffffffffc80),in_stack_fffffffffffffc7c);
  art_free((art_t *)CONCAT17(uVar1,in_stack_fffffffffffffc80));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  return;
}

Assistant:

DEFINE_TEST(test_art_upper_bound) {
    std::vector<const char*> keys = {
        "000001", "000002", "000003", "000004", "001005",
    };
    std::vector<art_val_t> values = {1, 2, 3, 4, 5};
    art_t art;
    art_init_cleared(&art);
    for (size_t i = 0; i < keys.size(); ++i) {
        art_insert(&art, (art_key_chunk_t*)keys[i], values[i]);
        assert_art_valid(&art);
    }

    {
        const char* key = "000002";
        art_iterator_t iterator = art_upper_bound(&art, (art_key_chunk_t*)key);
        size_t i = 2;
        do {
            assert_true(iterator.value != NULL);
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[i]);
            assert_true(*iterator.value == values[i]);
            ++i;
        } while (art_iterator_next(&iterator));
    }
    {
        const char* key = "000005";
        art_iterator_t iterator = art_upper_bound(&art, (art_key_chunk_t*)key);
        assert_true(iterator.value != NULL);
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[4]);
        assert_true(*iterator.value == values[4]);
        assert_false(art_iterator_next(&iterator));
    }
    {
        const char* key = "001006";
        art_iterator_t iterator = art_upper_bound(&art, (art_key_chunk_t*)key);
        assert_true(iterator.value == NULL);
    }
    art_free(&art);
}